

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayout.cpp
# Opt level: O2

ControlTypes __thiscall QLayout::controlTypes(QLayout *this)

{
  int iVar1;
  uint uVar2;
  long *plVar3;
  QFlagsStorage<QSizePolicy::ControlType> QVar4;
  
  iVar1 = (**(code **)(*(long *)this + 200))();
  if (iVar1 == 0) {
    QVar4.i = 1;
  }
  else {
    iVar1 = (**(code **)(*(long *)this + 200))(this);
    QVar4.i = 0;
    while (0 < iVar1) {
      iVar1 = iVar1 + -1;
      plVar3 = (long *)(**(code **)(*(long *)this + 0xa8))(this,iVar1);
      uVar2 = (**(code **)(*plVar3 + 0x80))(plVar3);
      QVar4.i = QVar4.i | uVar2;
    }
  }
  return (QFlagsStorageHelper<QSizePolicy::ControlType,_4>)
         (QFlagsStorageHelper<QSizePolicy::ControlType,_4>)QVar4.i;
}

Assistant:

QSizePolicy::ControlTypes QLayout::controlTypes() const
{
    if (count() == 0)
        return QSizePolicy::DefaultType;
    QSizePolicy::ControlTypes types;
    for (int i = count() - 1; i >= 0; --i)
        types |= itemAt(i)->controlTypes();
    return types;
}